

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CreationTest.cpp
# Opt level: O2

void __thiscall
TApp_IncorrectConstructionFlagExpected_Test::TestBody
          (TApp_IncorrectConstructionFlagExpected_Test *this)

{
  bool bVar1;
  Option *this_00;
  AssertHelper local_60;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_58;
  string local_50;
  string local_30;
  
  std::__cxx11::string::string((string *)&local_30,"--cat",(allocator *)&local_58);
  std::__cxx11::string::string((string *)&local_50,"",(allocator *)&local_60);
  this_00 = CLI::App::add_flag(&(this->super_TApp).app,&local_30,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_30);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      CLI::Option::expected(this_00,0);
    }
  }
  else {
    testing::Message::Message((Message *)&local_58);
    testing::internal::AssertHelper::AssertHelper
              (&local_60,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/CreationTest.cpp"
               ,0x80,"Expected: cat->expected(0) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=(&local_60,(Message *)&local_58);
    testing::internal::AssertHelper::~AssertHelper(&local_60);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(&local_58);
  }
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    CLI::Option::expected(this_00,1);
  }
  testing::Message::Message((Message *)&local_58);
  testing::internal::AssertHelper::AssertHelper
            (&local_60,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/CreationTest.cpp"
             ,0x81,
             "Expected: cat->expected(1) throws an exception of type CLI::IncorrectConstruction.\n  Actual: it throws nothing."
            );
  testing::internal::AssertHelper::operator=(&local_60,(Message *)&local_58);
  testing::internal::AssertHelper::~AssertHelper(&local_60);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~scoped_ptr(&local_58);
  return;
}

Assistant:

TEST_F(TApp, IncorrectConstructionFlagExpected) {
    auto cat = app.add_flag("--cat");
    EXPECT_NO_THROW(cat->expected(0));
    EXPECT_THROW(cat->expected(1), CLI::IncorrectConstruction);
}